

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half.h
# Opt level: O1

void std::
     __move_median_to_first<__gnu_cxx::__normal_iterator<Rgbaz*,std::vector<Rgbaz,std::allocator<Rgbaz>>>,__gnu_cxx::__ops::_Iter_less_iter>
               (undefined8 *__result,undefined8 *__a,undefined8 *__b,undefined8 *__c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  
  fVar1 = *(float *)(_imath_half_to_float_table + (ulong)*(ushort *)(__a + 1) * 4);
  fVar2 = *(float *)(_imath_half_to_float_table + (ulong)*(ushort *)(__b + 1) * 4);
  if ((fVar1 < fVar2) ||
     ((fVar1 <= fVar2 && (*(uint *)((long)__a + 0x1c) < *(uint *)((long)__b + 0x1c))))) {
    fVar3 = *(float *)(_imath_half_to_float_table + (ulong)*(ushort *)(__c + 1) * 4);
    if ((fVar3 <= fVar2) &&
       ((fVar3 < fVar2 || (*(uint *)((long)__c + 0x1c) <= *(uint *)((long)__b + 0x1c))))) {
      if ((fVar1 < fVar3) ||
         ((fVar1 <= fVar3 && (*(uint *)((long)__a + 0x1c) < *(uint *)((long)__c + 0x1c)))))
      goto LAB_00107f49;
      goto LAB_00107f87;
    }
  }
  else {
    fVar3 = *(float *)(_imath_half_to_float_table + (ulong)*(ushort *)(__c + 1) * 4);
    if ((fVar1 < fVar3) ||
       ((fVar1 <= fVar3 && (*(uint *)((long)__a + 0x1c) < *(uint *)((long)__c + 0x1c))))) {
LAB_00107f87:
      uVar4 = *__result;
      uVar5 = __result[1];
      uVar6 = __result[2];
      uVar7 = __result[3];
      uVar8 = *__a;
      uVar9 = __a[1];
      uVar10 = __a[3];
      __result[2] = __a[2];
      __result[3] = uVar10;
      *__result = uVar8;
      __result[1] = uVar9;
      __a[2] = uVar6;
      __a[3] = uVar7;
      *__a = uVar4;
      __a[1] = uVar5;
      return;
    }
    if ((fVar2 < fVar3) ||
       ((fVar2 <= fVar3 && (*(uint *)((long)__b + 0x1c) < *(uint *)((long)__c + 0x1c))))) {
LAB_00107f49:
      uVar4 = *__result;
      uVar5 = __result[1];
      uVar6 = __result[2];
      uVar7 = __result[3];
      uVar8 = *__c;
      uVar9 = __c[1];
      uVar10 = __c[3];
      __result[2] = __c[2];
      __result[3] = uVar10;
      *__result = uVar8;
      __result[1] = uVar9;
      __c[2] = uVar6;
      __c[3] = uVar7;
      *__c = uVar4;
      __c[1] = uVar5;
      return;
    }
  }
  uVar4 = *__result;
  uVar5 = __result[1];
  uVar6 = __result[2];
  uVar7 = __result[3];
  uVar8 = *__b;
  uVar9 = __b[1];
  uVar10 = __b[3];
  __result[2] = __b[2];
  __result[3] = uVar10;
  *__result = uVar8;
  __result[1] = uVar9;
  __b[2] = uVar6;
  __b[3] = uVar7;
  *__b = uVar4;
  __b[1] = uVar5;
  return;
}

Assistant:

inline half::operator float () const IMATH_NOEXCEPT
{
    return imath_half_to_float (_h);
}